

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
common_sampler_sample_and_accept_n
          (common_sampler *gsmpl,llama_context *ctx,vector<int,_std::allocator<int>_> *idxs,
          llama_tokens *draft,bool grammar_first)

{
  llama_token lVar1;
  size_type sVar2;
  size_type sVar3;
  common_sampler *pcVar4;
  const_reference pvVar5;
  vector<int,_std::allocator<int>_> *in_RCX;
  common_sampler *in_RDX;
  undefined8 in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  vector<int,_std::allocator<int>_> *in_R8;
  llama_token id_1;
  llama_token id;
  size_t i;
  vector<int,_std::allocator<int>_> *result;
  undefined8 in_stack_ffffffffffffff58;
  common_sampler *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  common_sampler *gsmpl_00;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb0;
  llama_token in_stack_ffffffffffffffb4;
  common_sampler *pcVar6;
  
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RCX);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(in_R8);
  if (sVar2 != sVar3 + 1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/sampling.cpp"
               ,0x184,"GGML_ASSERT(%s) failed",
               "idxs.size() == draft.size() + 1 && \"idxs.size() must be draft.size() + 1\"");
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x366925);
  std::vector<int,_std::allocator<int>_>::size(in_RCX);
  std::vector<int,_std::allocator<int>_>::reserve
            (in_stack_ffffffffffffff90,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
            );
  pcVar6 = (common_sampler *)0x0;
  while (gsmpl_00 = pcVar6,
        pcVar4 = (common_sampler *)std::vector<int,_std::allocator<int>_>::size(in_R8),
        pcVar6 < pcVar4) {
    std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(size_type)gsmpl_00);
    in_stack_ffffffffffffffb4 =
         common_sampler_sample
                   (gsmpl_00,(llama_context *)
                             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                    (int)(sVar2 >> 0x20),SUB81(sVar2 >> 0x18,0));
    common_sampler_accept
              (in_stack_ffffffffffffff60,(llama_token)((ulong)in_stack_ffffffffffffff58 >> 0x20),
               SUB81((ulong)in_stack_ffffffffffffff58 >> 0x18,0));
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffff70,
               (value_type_conflict1 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68)
              );
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_R8,(size_type)gsmpl_00);
    if (*pvVar5 != in_stack_ffffffffffffffb4) break;
    pcVar6 = (common_sampler *)
             ((long)&(((_Vector_impl *)&(gsmpl_00->params).seed)->super__Vector_impl_data)._M_start
             + 1);
  }
  pcVar6 = gsmpl_00;
  pcVar4 = (common_sampler *)std::vector<int,_std::allocator<int>_>::size(in_R8);
  if (gsmpl_00 == pcVar4) {
    std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(size_type)pcVar6);
    lVar1 = common_sampler_sample
                      (pcVar6,(llama_context *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                       (int)(sVar2 >> 0x20),SUB81(sVar2 >> 0x18,0));
    common_sampler_accept
              (in_RDX,(llama_token)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0));
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)gsmpl_00,
               (value_type_conflict1 *)CONCAT44(lVar1,in_stack_ffffffffffffff68));
  }
  return in_RDI;
}

Assistant:

std::vector<llama_token> common_sampler_sample_and_accept_n(struct common_sampler * gsmpl, struct llama_context * ctx, const std::vector<int> & idxs, const llama_tokens & draft, bool grammar_first) {
    GGML_ASSERT(idxs.size() == draft.size() + 1 && "idxs.size() must be draft.size() + 1");

    std::vector<llama_token> result;
    result.reserve(idxs.size());

    size_t i = 0;
    for (; i < draft.size(); i++) {
        const llama_token id = common_sampler_sample(gsmpl, ctx, idxs[i], grammar_first);

        common_sampler_accept(gsmpl, id, true);

        result.push_back(id);

        if (draft[i] != id) {
            break;
        }
    }

    if (i == draft.size()) {
        const llama_token id = common_sampler_sample(gsmpl, ctx, idxs[i], grammar_first);

        common_sampler_accept(gsmpl, id, true);

        result.push_back(id);
    }

    return result;
}